

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

monster_race * get_mon_race_aux(long total,alloc_entry *table)

{
  uint32_t uVar1;
  long lVar2;
  long local_28;
  long value;
  wchar_t i;
  alloc_entry *table_local;
  long total_local;
  
  uVar1 = Rand_div((uint32_t)total);
  value._4_4_ = 0;
  for (local_28 = (long)(int)uVar1;
      (value._4_4_ < alloc_race_size && (table[value._4_4_].prob3 <= local_28));
      local_28 = local_28 - table[lVar2].prob3) {
    lVar2 = (long)value._4_4_;
    value._4_4_ = value._4_4_ + 1;
  }
  return r_info + table[value._4_4_].index;
}

Assistant:

static struct monster_race *get_mon_race_aux(long total,
											 const alloc_entry *table)
{
	int i;

	/* Pick a monster */
	long value = randint0(total);

	/* Find the monster */
	for (i = 0; i < alloc_race_size; i++) {
		/* Found the entry */
		if (value < table[i].prob3) break;

		/* Decrement */
		value -= table[i].prob3;
	}

	return &r_info[table[i].index];
}